

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  FILE *__stream;
  void *__ptr;
  void *__ptr_00;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT ntri;
  REF_INT nedge;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT node;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  if (ref_grid->twod == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x836,
           "ref_export_bamg_msh","expected twod convention grid");
    ref_grid_local._4_4_ = 1;
  }
  else {
    __stream = fopen(filename,"w");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x83a,"ref_export_bamg_msh","unable to open file");
      ref_grid_local._4_4_ = 2;
    }
    else {
      fprintf(__stream,"MeshVersionFormatted 0\n\n");
      fprintf(__stream,"Dimension 2\n\n");
      if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x83f,"ref_export_bamg_msh","malloc o2n of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        __ptr = malloc((long)pRVar1->max << 2);
        if (__ptr == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
                 0x83f,"ref_export_bamg_msh","malloc o2n of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < pRVar1->max;
              ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
            *(undefined4 *)((long)__ptr + (long)ref_private_status_reis_ai._4_4_ * 4) = 0xffffffff;
          }
          if (pRVar1->max < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x840,"ref_export_bamg_msh","malloc n2o of REF_INT negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            __ptr_00 = malloc((long)pRVar1->max << 2);
            if (__ptr_00 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x840,"ref_export_bamg_msh","malloc n2o of REF_INT NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_status_reis_ai._0_4_ = 0;
                  (int)ref_private_status_reis_ai < pRVar1->max;
                  ref_private_status_reis_ai._0_4_ = (int)ref_private_status_reis_ai + 1) {
                *(undefined4 *)((long)__ptr_00 + (long)(int)ref_private_status_reis_ai * 4) =
                     0xffffffff;
              }
              ref_cell._4_4_ = 0;
              for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
                if (((-1 < o2n._4_4_) && (o2n._4_4_ < pRVar1->max)) &&
                   (-1 < pRVar1->global[o2n._4_4_])) {
                  *(uint *)((long)__ptr + (long)o2n._4_4_ * 4) = ref_cell._4_4_;
                  *(int *)((long)__ptr_00 + (long)(int)ref_cell._4_4_ * 4) = o2n._4_4_;
                  ref_cell._4_4_ = ref_cell._4_4_ + 1;
                }
              }
              fprintf(__stream,"\nVertices\n%d\n",(ulong)ref_cell._4_4_);
              for (o2n._4_4_ = 0; o2n._4_4_ < (int)ref_cell._4_4_; o2n._4_4_ = o2n._4_4_ + 1) {
                fprintf(__stream,"%.16E %.16E %d\n",
                        pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf],
                        pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 2],1);
              }
              unique0x00012000 = ref_grid->cell[0];
              fprintf(__stream,"\nEdges\n%d\n",(ulong)(uint)unique0x00012000->n);
              ref_malloc_init_i = 0;
              for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffa8->max;
                  nodes[0x19] = nodes[0x19] + 1) {
                RVar2 = ref_cell_nodes(stack0xffffffffffffffa8,nodes[0x19],&ntri);
                if (RVar2 == 0) {
                  ref_malloc_init_i = ref_malloc_init_i + 1;
                  fprintf(__stream,"%d %d %d\n",(ulong)(*(int *)((long)__ptr + (long)ntri * 4) + 1),
                          (ulong)(*(int *)((long)__ptr + (long)nedge * 4) + 1),(ulong)(uint)nodes[0]
                         );
                }
              }
              if ((long)ref_malloc_init_i == (long)stack0xffffffffffffffa8->n) {
                unique0x00012000 = ref_grid->cell[3];
                fprintf(__stream,"\nTriangles\n%d\n",(ulong)(uint)unique0x00012000->n);
                ref_malloc_init_i_1 = 0;
                for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffa8->max;
                    nodes[0x19] = nodes[0x19] + 1) {
                  RVar2 = ref_cell_nodes(stack0xffffffffffffffa8,nodes[0x19],&ntri);
                  if (RVar2 == 0) {
                    ref_malloc_init_i_1 = ref_malloc_init_i_1 + 1;
                    fprintf(__stream,"%d %d %d %d\n",
                            (ulong)(*(int *)((long)__ptr + (long)ntri * 4) + 1),
                            (ulong)(*(int *)((long)__ptr + (long)nodes[0] * 4) + 1),
                            (ulong)(*(int *)((long)__ptr + (long)nedge * 4) + 1),
                            (ulong)(uint)nodes[1]);
                  }
                }
                if ((long)ref_malloc_init_i_1 == (long)stack0xffffffffffffffa8->n) {
                  if (__ptr_00 != (void *)0x0) {
                    free(__ptr_00);
                  }
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                  fclose(__stream);
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                         ,0x860,"ref_export_bamg_msh","triangle miscount",(long)ref_malloc_init_i_1,
                         (long)stack0xffffffffffffffa8->n);
                  ref_grid_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x856,"ref_export_bamg_msh","edge/quad miscount",(long)ref_malloc_init_i,
                       (long)stack0xffffffffffffffa8->n);
                ref_grid_local._4_4_ = 1;
              }
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_bamg_msh(REF_GRID ref_grid,
                                              const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nedge;
  REF_INT ntri;

  RAS(ref_grid_twod(ref_grid), "expected twod convention grid");

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "MeshVersionFormatted 0\n\n");
  fprintf(f, "Dimension 2\n\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  ref_malloc_init(n2o, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    o2n[node] = nnode;
    n2o[nnode] = node;
    nnode++;
  }

  fprintf(f, "\nVertices\n%d\n", nnode);
  for (node = 0; node < nnode; node++) {
    fprintf(f, "%.16E %.16E %d\n", ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]), 1);
  }

  ref_cell = ref_grid_edg(ref_grid);
  fprintf(f, "\nEdges\n%d\n", ref_cell_n(ref_cell));
  nedge = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    nedge++;
    fprintf(f, "%d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[1]] + 1, nodes[2]);
  }
  REIS(nedge, ref_cell_n(ref_cell), "edge/quad miscount");

  ref_cell = ref_grid_tri(ref_grid);
  fprintf(f, "\nTriangles\n%d\n", ref_cell_n(ref_cell));
  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    ntri++;
    fprintf(f, "%d %d %d %d\n", o2n[nodes[0]] + 1, o2n[nodes[2]] + 1,
            o2n[nodes[1]] + 1, nodes[3]);
  }
  REIS(ntri, ref_cell_n(ref_cell), "triangle miscount");

  ref_free(n2o);
  ref_free(o2n);

  fclose(f);

  return REF_SUCCESS;
}